

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ObjPrint(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Wec_t *pVVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  
  if (pObj == (Gia_Obj_t *)0x0) {
    printf("Object is NULL.");
    return;
  }
  if (((ulong)pObj & 1) != 0) {
    printf("Compl ");
    pObj = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x51f,"void Gia_ObjPrint(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar8 = p->pObjs;
  if ((pObj < pGVar8) || (pGVar8 + p->nObjs <= pObj)) goto LAB_00789942;
  printf("Obj %4d : ",(ulong)(uint)((int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555));
  uVar11 = *(ulong *)pObj;
  if ((~uVar11 & 0x1fffffff1fffffff) == 0) {
    pcVar12 = "constant 0";
LAB_007894bf:
    printf(pcVar12);
  }
  else {
    uVar9 = (uint)uVar11;
    uVar5 = (uint)(uVar11 >> 0x20);
    if (((uVar9 & 0x9fffffff) == 0x9fffffff) &&
       ((int)(uVar5 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
      pcVar12 = "PI";
      goto LAB_007894bf;
    }
    if (((uVar11 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar9) ||
       (p->vCos->nSize - p->nRegs <= (int)(uVar5 & 0x1fffffff))) {
      if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
        iVar6 = p->vCis->nSize;
        if ((int)(uVar5 & 0x1fffffff) < iVar6 - p->nRegs) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar1 = p->vCos->nSize;
        uVar9 = (iVar1 - iVar6) + (uVar5 & 0x1fffffff);
        if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_00789afc;
        iVar6 = p->vCos->pArray[uVar9];
        if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar11 = (ulong)(iVar6 - (*(uint *)(p->pObjs + iVar6) & 0x1fffffff));
        pcVar12 = "\'";
        if ((*(uint *)(p->pObjs + iVar6) >> 0x1d & 1) == 0) {
          pcVar12 = " ";
        }
        pcVar13 = "RO( %4d%s )";
        goto LAB_0078968d;
      }
      iVar6 = (int)(uVar11 & 0x1fffffff);
      if (iVar6 != 0x1fffffff && (int)uVar9 < 0) {
        uVar9 = Gia_ObjFaninId0p(p,pObj);
        pcVar12 = "\'";
        if ((*(uint *)pObj >> 0x1d & 1) == 0) {
          pcVar12 = " ";
        }
        pcVar13 = "RI( %4d%s )";
        uVar11 = (ulong)uVar9;
        goto LAB_0078968d;
      }
      if ((iVar6 == 0x1fffffff || (int)uVar9 < 0) || ((uVar5 & 0x1fffffff) <= (uVar9 & 0x1fffffff)))
      {
        iVar6 = Gia_ObjId(p,pObj);
        if ((p->pMuxes == (uint *)0x0) || (p->pMuxes[iVar6] == 0)) {
          uVar9 = Gia_ObjFaninId0p(p,pObj);
          pcVar13 = "\'";
          pcVar12 = "\'";
          if ((*(uint *)pObj >> 0x1d & 1) == 0) {
            pcVar12 = " ";
          }
          uVar5 = Gia_ObjFaninId1p(p,pObj);
          if ((*(ulong *)pObj >> 0x3d & 1) == 0) {
            pcVar13 = " ";
          }
          pcVar14 = "AND( %4d%s, %4d%s )";
          goto LAB_00789ae6;
        }
        uVar9 = Gia_ObjFaninId2p(p,pObj);
        iVar6 = Gia_ObjFaninC2(p,pObj);
        pcVar13 = "\'";
        pcVar12 = "\'";
        if (iVar6 == 0) {
          pcVar12 = " ";
        }
        uVar5 = Gia_ObjFaninId1p(p,pObj);
        pcVar14 = "\'";
        if ((*(ulong *)pObj >> 0x3d & 1) == 0) {
          pcVar14 = " ";
        }
        uVar7 = Gia_ObjFaninId0p(p,pObj);
        if ((*(uint *)pObj >> 0x1d & 1) == 0) {
          pcVar13 = " ";
        }
        printf("MUX( %4d%s, %4d%s, %4d%s )",(ulong)uVar9,pcVar12,(ulong)uVar5,pcVar14,(ulong)uVar7,
               pcVar13);
      }
      else {
        uVar9 = Gia_ObjFaninId0p(p,pObj);
        pcVar13 = "\'";
        pcVar12 = "\'";
        if ((*(uint *)pObj >> 0x1d & 1) == 0) {
          pcVar12 = " ";
        }
        uVar5 = Gia_ObjFaninId1p(p,pObj);
        if ((*(ulong *)pObj >> 0x3d & 1) == 0) {
          pcVar13 = " ";
        }
        pcVar14 = "XOR( %4d%s, %4d%s )";
LAB_00789ae6:
        printf(pcVar14,(ulong)uVar9,pcVar12,(ulong)uVar5,pcVar13);
      }
    }
    else {
      pGVar8 = p->pObjs;
      if ((pObj < pGVar8) || (pGVar8 + p->nObjs <= pObj)) goto LAB_00789942;
      uVar11 = (ulong)((int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555 -
                      (uVar9 & 0x1fffffff));
      pcVar12 = "\'";
      if ((uVar9 >> 0x1d & 1) == 0) {
        pcVar12 = " ";
      }
      pcVar13 = "PO( %4d%s )";
LAB_0078968d:
      printf(pcVar13,uVar11,pcVar12);
    }
  }
  if (p->pRefs != (int *)0x0) {
    pGVar8 = p->pObjs;
    if ((pObj < pGVar8) || (pGVar8 + p->nObjs <= pObj)) goto LAB_00789942;
    printf(" (refs = %3d)",
           (ulong)(uint)p->pRefs[(int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555]);
  }
  if ((pObj->field_0x3 & 0x40) != 0) {
    printf(" mark0");
  }
  if ((pObj->field_0x7 & 0x40) != 0) {
    printf(" mark1");
  }
  pVVar2 = p->vMapping;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pGVar8 = p->pObjs;
    if ((pObj < pGVar8) || (pGVar8 + p->nObjs <= pObj)) goto LAB_00789942;
    uVar9 = (int)((long)pObj - (long)pGVar8 >> 2) * -0x55555555;
    if (((int)uVar9 < 0) || (pVVar2->nSize <= (int)uVar9)) {
LAB_00789afc:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (pVVar2->pArray[uVar9 & 0x7fffffff] != 0) {
      printf(" Cut = { ");
      pGVar8 = p->pObjs;
      if (pGVar8 <= pObj) {
        lVar15 = 0;
        do {
          if (pGVar8 + p->nObjs <= pObj) break;
          uVar9 = (int)((long)pObj - (long)pGVar8 >> 2) * -0x55555555;
          if ((int)uVar9 < 0) goto LAB_00789afc;
          iVar6 = p->vMapping->nSize;
          if (iVar6 <= (int)uVar9) goto LAB_00789afc;
          piVar3 = p->vMapping->pArray;
          lVar10 = (long)piVar3[uVar9 & 0x7fffffff];
          if ((lVar10 < 0) || (iVar6 <= piVar3[uVar9 & 0x7fffffff])) goto LAB_00789afc;
          if (piVar3[lVar10] <= lVar15) {
            putchar(0x7d);
            goto LAB_00789836;
          }
          printf("%d ",(ulong)(uint)piVar3[lVar10 + lVar15 + 1]);
          lVar15 = lVar15 + 1;
          pGVar8 = p->pObjs;
        } while (pGVar8 <= pObj);
      }
      goto LAB_00789942;
    }
  }
LAB_00789836:
  pVVar4 = p->vMapping2;
  if (pVVar4 == (Vec_Wec_t *)0x0) {
LAB_0078996b:
    putchar(10);
    return;
  }
  pGVar8 = p->pObjs;
  if ((pGVar8 <= pObj) && (pObj < pGVar8 + p->nObjs)) {
    uVar9 = (int)((long)pObj - (long)pGVar8 >> 2) * -0x55555555;
    if (((int)uVar9 < 0) || (pVVar4->nSize <= (int)uVar9)) {
LAB_00789b1b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    if (pVVar4->pArray[uVar9 & 0x7fffffff].nSize == 0) goto LAB_0078996b;
    printf(" Cut = { ");
    pGVar8 = p->pObjs;
    if (pGVar8 <= pObj) {
      lVar15 = 0;
      do {
        if (pGVar8 + p->nObjs <= pObj) break;
        uVar9 = (int)((long)pObj - (long)pGVar8 >> 2) * -0x55555555;
        if (((int)uVar9 < 0) || (p->vMapping2->nSize <= (int)uVar9)) goto LAB_00789b1b;
        pVVar2 = p->vMapping2->pArray;
        uVar9 = uVar9 & 0x7fffffff;
        if (pVVar2[uVar9].nSize <= lVar15) {
          putchar(0x7d);
          goto LAB_0078996b;
        }
        if (pVVar2[uVar9].nSize <= lVar15) goto LAB_00789afc;
        printf("%d ",(ulong)(uint)pVVar2[uVar9].pArray[lVar15]);
        lVar15 = lVar15 + 1;
        pGVar8 = p->pObjs;
      } while (pGVar8 <= pObj);
    }
  }
LAB_00789942:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ObjPrint( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj == NULL )
    {
        printf( "Object is NULL." );
        return;
    }
    if ( Gia_IsComplement(pObj) )
    {
        printf( "Compl " );
        pObj = Gia_Not(pObj);
    }
    assert( !Gia_IsComplement(pObj) );
    printf( "Obj %4d : ", Gia_ObjId(p, pObj) );
    if ( Gia_ObjIsConst0(pObj) )
        printf( "constant 0" );
    else if ( Gia_ObjIsPi(p, pObj) )
        printf( "PI" );
    else if ( Gia_ObjIsPo(p, pObj) )
        printf( "PO( %4d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsCi(pObj) )
        printf( "RO( %4d%s )", Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)), (Gia_ObjFaninC0(Gia_ObjRoToRi(p, pObj))? "\'" : " ") );
    else if ( Gia_ObjIsCo(pObj) )
        printf( "RI( %4d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
//    else if ( Gia_ObjIsBuf(pObj) )
//        printf( "BUF( %d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsXor(pObj) )
        printf( "XOR( %4d%s, %4d%s )", 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsMuxId(p, Gia_ObjId(p, pObj)) )
        printf( "MUX( %4d%s, %4d%s, %4d%s )", 
            Gia_ObjFaninId2p(p, pObj), (Gia_ObjFaninC2(p, pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " "), 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %4d%s, %4d%s )", 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " ") );
    if ( p->pRefs )
        printf( " (refs = %3d)", Gia_ObjRefNum(p, pObj) );
    if ( pObj->fMark0 )
        printf( " mark0" );
    if ( pObj->fMark1 )
        printf( " mark1" );
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, Gia_ObjId(p, pObj)) )
    {
        int i, iFan;
        printf( " Cut = { " );
        Gia_LutForEachFanin( p, Gia_ObjId(p, pObj), iFan, i )
            printf( "%d ", iFan );
        printf( "}" );
    }
    if ( Gia_ManHasMapping2(p) && Gia_ObjIsLut2(p, Gia_ObjId(p, pObj)) )
    {
        int i, iFan;
        printf( " Cut = { " );
        Gia_LutForEachFanin2( p, Gia_ObjId(p, pObj), iFan, i )
            printf( "%d ", iFan );
        printf( "}" );
    }
    printf( "\n" );
/*
    if ( p->pRefs )
    {
        Gia_Obj_t * pFanout;
        int i;
        int iFan = -1; // Suppress "might be used uninitialized"
        printf( "\nFanouts:\n" );
        Gia_ObjForEachFanout( p, pObj, pFanout, iFan, i )
        {
            printf( "    " );
            printf( "Node %4d : ", Gia_ObjId(pFanout) );
            if ( Gia_ObjIsPo(pFanout) )
                printf( "PO( %4d%s )", Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " ") );
            else if ( Gia_ObjIsBuf(pFanout) )
                printf( "BUF( %d%s )", Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " ") );
            else
                printf( "AND( %4d%s, %4d%s )", 
                    Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " "), 
                    Gia_ObjFanin1(pFanout)->Id, (Gia_ObjFaninC1(pFanout)? "\'" : " ") );
            printf( "\n" );
        }
        return;
    }
*/
}